

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderBuiltinVarTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::sr::anon_unknown_1::BuiltinInputVariationsCaseInstance::iterate
          (TestStatus *__return_storage_ptr__,BuiltinInputVariationsCaseInstance *this)

{
  TextureFormat TVar1;
  ushort uVar2;
  bool bVar3;
  int i_2;
  int i;
  long lVar4;
  int iVar5;
  int iVar6;
  float fVar7;
  Vec4 color;
  RGBA threshold;
  Surface refImage;
  Surface resImage;
  VkPushConstantRange pcRanges;
  deUint16 indices [12];
  UVec2 viewportSize;
  PixelBufferAccess local_f0;
  RGBA local_c8;
  RGBA local_c4;
  Surface local_c0;
  Surface local_a8;
  ConstPixelBufferAccess local_90;
  VkPushConstantRange local_68;
  deUint16 local_58 [16];
  int local_38;
  int local_34;
  
  ShaderRenderCaseInstance::getViewportSize(&this->super_ShaderRenderCaseInstance);
  local_c4.m_value = 0x2020202;
  tcu::Surface::Surface(&local_a8,local_38,local_34);
  tcu::Surface::Surface(&local_c0,local_38,local_34);
  local_68.size = 0x10;
  local_68.stageFlags = 0x10;
  local_68.offset = 0;
  local_58[0] = 0;
  local_58[1] = 4;
  local_58[2] = 1;
  local_58[3] = 0;
  local_58[4] = 5;
  local_58[5] = 4;
  local_58[6] = 1;
  local_58[7] = 2;
  local_58[8] = 3;
  local_58[9] = 1;
  local_58[10] = 3;
  local_58[0xb] = 4;
  (*(this->super_ShaderRenderCaseInstance).super_TestInstance._vptr_TestInstance[4])(this);
  if ((this->m_shaderInputTypes & 4) != 0) {
    ShaderRenderCaseInstance::setPushConstantRanges
              (&this->super_ShaderRenderCaseInstance,1,&local_68);
  }
  local_f0.super_ConstPixelBufferAccess.m_format.order = 0x3e000000;
  local_f0.super_ConstPixelBufferAccess.m_format.type = 0x3e800000;
  local_f0.super_ConstPixelBufferAccess.m_size.m_data[0] = 0x3f000000;
  local_f0.super_ConstPixelBufferAccess.m_size.m_data[1] = 0x3f800000;
  ShaderRenderCaseInstance::render
            (&this->super_ShaderRenderCaseInstance,6,4,local_58,(Vec4 *)&local_f0);
  local_90.m_format.order = RGBA;
  local_90.m_format.type = UNORM_INT8;
  if ((void *)local_a8.m_pixels.m_cap != (void *)0x0) {
    local_a8.m_pixels.m_cap = (size_t)local_a8.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_f0,&local_90.m_format,local_a8.m_width,local_a8.m_height,1,
             (void *)local_a8.m_pixels.m_cap);
  tcu::TextureLevel::getAccess(&local_90,&(this->super_ShaderRenderCaseInstance).m_resultImage);
  tcu::copy((EVP_PKEY_CTX *)&local_f0,(EVP_PKEY_CTX *)&local_90);
  if (0 < local_c0.m_height) {
    iVar6 = 0;
    do {
      if (0 < local_c0.m_width) {
        iVar5 = 0;
        do {
          local_f0.super_ConstPixelBufferAccess.m_format.order = 0x3dcccccd;
          local_f0.super_ConstPixelBufferAccess.m_format.type = 0x3e4ccccd;
          local_f0.super_ConstPixelBufferAccess.m_size.m_data[0] = 0x3e99999a;
          local_f0.super_ConstPixelBufferAccess.m_size.m_data[1] = 0x3f800000;
          uVar2 = this->m_shaderInputTypes;
          if ((local_c0.m_width / 2 <= iVar5 & (byte)uVar2) == 0) {
            if ((uVar2 & 2) == 0) {
              local_90.m_format.order = 0x3e99999a;
              local_90.m_format.type = 0x3e4ccccd;
              local_90.m_size.m_data[0] = 0x3dcccccd;
              local_90.m_size.m_data[1] = 0;
              lVar4 = 0;
              do {
                local_f0.super_ConstPixelBufferAccess.m_size.m_data[lVar4 + -2] =
                     (int)((float)local_90.m_size.m_data[lVar4 + -2] +
                          (float)local_f0.super_ConstPixelBufferAccess.m_size.m_data[lVar4 + -2]);
                lVar4 = lVar4 + 1;
              } while (lVar4 != 4);
            }
            else {
              fVar7 = ((float)iVar5 + 0.5) / (float)local_c0.m_width;
              local_90.m_format.type = (ChannelType)(fVar7 * 0.6);
              local_90.m_format.order = (ChannelOrder)((1.0 - fVar7) * 0.6);
              local_90.m_size.m_data[0] = 0;
              local_90.m_size.m_data[1] = 0;
              lVar4 = 0;
              do {
                local_f0.super_ConstPixelBufferAccess.m_size.m_data[lVar4 + -2] =
                     (int)((float)local_90.m_size.m_data[lVar4 + -2] +
                          (float)local_f0.super_ConstPixelBufferAccess.m_size.m_data[lVar4 + -2]);
                lVar4 = lVar4 + 1;
              } while (lVar4 != 4);
            }
          }
          if ((uVar2 & 4) != 0) {
            lVar4 = 0;
            do {
              local_f0.super_ConstPixelBufferAccess.m_size.m_data[lVar4 + -2] =
                   (int)((this->m_constantColor).m_data[lVar4] +
                        (float)local_f0.super_ConstPixelBufferAccess.m_size.m_data[lVar4 + -2]);
              lVar4 = lVar4 + 1;
            } while (lVar4 != 4);
          }
          tcu::RGBA::RGBA(&local_c8,(Vec4 *)&local_f0);
          *(deUint32 *)
           ((long)local_c0.m_pixels.m_ptr + (long)(local_c0.m_width * iVar6 + iVar5) * 4) =
               local_c8.m_value;
          iVar5 = iVar5 + 1;
        } while (iVar5 < local_c0.m_width);
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 < local_c0.m_height);
  }
  bVar3 = tcu::pixelThresholdCompare
                    (((this->super_ShaderRenderCaseInstance).super_TestInstance.m_context)->
                     m_testCtx->m_log,"Result","Image comparison result",&local_c0,&local_a8,
                     &local_c4,COMPARE_LOG_RESULT);
  TVar1 = (TextureFormat)(local_f0.super_ConstPixelBufferAccess.m_size.m_data + 2);
  local_f0.super_ConstPixelBufferAccess.m_format = TVar1;
  if (bVar3) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,"Result image matches reference","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,
               local_f0.super_ConstPixelBufferAccess.m_format,
               (undefined1 *)
               (local_f0.super_ConstPixelBufferAccess.m_size.m_data._0_8_ +
               (long)local_f0.super_ConstPixelBufferAccess.m_format));
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"Image mismatch","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,
               local_f0.super_ConstPixelBufferAccess.m_format,
               (undefined1 *)
               (local_f0.super_ConstPixelBufferAccess.m_size.m_data._0_8_ +
               (long)local_f0.super_ConstPixelBufferAccess.m_format));
  }
  if (local_f0.super_ConstPixelBufferAccess.m_format != TVar1) {
    operator_delete((void *)local_f0.super_ConstPixelBufferAccess.m_format,
                    local_f0.super_ConstPixelBufferAccess._16_8_ + 1);
  }
  tcu::Surface::~Surface(&local_c0);
  tcu::Surface::~Surface(&local_a8);
  return __return_storage_ptr__;
}

Assistant:

TestStatus BuiltinInputVariationsCaseInstance::iterate (void)
{
	const UVec2					viewportSize	= getViewportSize();
	const int					width			= viewportSize.x();
	const int					height			= viewportSize.y();
	const tcu::RGBA				threshold		(2, 2, 2, 2);
	Surface						resImage		(width, height);
	Surface						refImage		(width, height);
	bool						compareOk		= false;
	const VkPushConstantRange	pcRanges		=
	{
		VK_SHADER_STAGE_FRAGMENT_BIT,	// VkShaderStageFlags	stageFlags;
		0u,								// deUint32				offset;
		sizeof(Vec4)					// deUint32				size;
	};
	const deUint16				indices[12]		=
	{
		0, 4, 1,
		0, 5, 4,
		1, 2, 3,
		1, 3, 4
	};

	setup();

	if (m_shaderInputTypes & SHADER_INPUT_CONSTANT_BIT)
		setPushConstantRanges(1, &pcRanges);

	render(6, 4, indices);
	copy(resImage.getAccess(), getResultImage().getAccess());

	// Reference image
	for (int y = 0; y < refImage.getHeight(); y++)
	{
		for (int x = 0; x < refImage.getWidth(); x++)
		{
			Vec4 color (0.1f, 0.2f, 0.3f, 1.0f);

			if (((m_shaderInputTypes & SHADER_INPUT_BUILTIN_BIT) && (x < refImage.getWidth() / 2)) ||
				!(m_shaderInputTypes & SHADER_INPUT_BUILTIN_BIT))
			{
				if (m_shaderInputTypes & SHADER_INPUT_VARYING_BIT)
				{
					const float xf = (float(x)+.5f) / float(refImage.getWidth());
					color += Vec4(0.6f * (1 - xf), 0.6f * xf, 0.0f, 0.0f);
				}
				else
					color += Vec4(0.3f, 0.2f, 0.1f, 0.0f);
			}

			if (m_shaderInputTypes & SHADER_INPUT_CONSTANT_BIT)
				color += m_constantColor;

			refImage.setPixel(x, y, RGBA(color));
		}
	}

	compareOk = pixelThresholdCompare(m_context.getTestContext().getLog(), "Result", "Image comparison result", refImage, resImage, threshold, COMPARE_LOG_RESULT);

	if (compareOk)
		return TestStatus::pass("Result image matches reference");
	else
		return TestStatus::fail("Image mismatch");
}